

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Error.hpp
# Opt level: O0

ArgumentMismatch *
CLI::ArgumentMismatch::AtLeast(ArgumentMismatch *__return_storage_ptr__,string *name,int num)

{
  string local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  int local_1c;
  string *psStack_18;
  int num_local;
  string *name_local;
  
  local_1c = num;
  psStack_18 = name;
  name_local = (string *)__return_storage_ptr__;
  ::std::operator+(&local_80,name,": At least ");
  std::__cxx11::to_string(&local_a0,local_1c);
  ::std::operator+(&local_60,&local_80,&local_a0);
  ::std::operator+(&local_40,&local_60," required");
  ArgumentMismatch(__return_storage_ptr__,&local_40);
  ::std::__cxx11::string::~string((string *)&local_40);
  ::std::__cxx11::string::~string((string *)&local_60);
  ::std::__cxx11::string::~string((string *)&local_a0);
  ::std::__cxx11::string::~string((string *)&local_80);
  return __return_storage_ptr__;
}

Assistant:

static ArgumentMismatch AtLeast(std::string name, int num) {
        return ArgumentMismatch(name + ": At least " + std::to_string(num) + " required");
    }